

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_5234ad::CheckIncludeGuardIsSet(cmMakefile *mf,string *includeGuardVar)

{
  char *pcVar1;
  cmState *pcVar2;
  cmStateSnapshot local_90;
  undefined1 local_78 [8];
  cmStateDirectory stateDir;
  undefined1 local_38 [8];
  cmStateSnapshot dirSnapshot;
  string *includeGuardVar_local;
  cmMakefile *mf_local;
  
  dirSnapshot.Position.Position = (PositionType)includeGuardVar;
  pcVar1 = cmMakefile::GetProperty(mf,includeGuardVar);
  if (pcVar1 == (char *)0x0) {
    cmMakefile::GetStateSnapshot((cmStateSnapshot *)&stateDir.Snapshot_.Position.Position,mf);
    cmStateSnapshot::GetBuildsystemDirectoryParent
              ((cmStateSnapshot *)local_38,(cmStateSnapshot *)&stateDir.Snapshot_.Position.Position)
    ;
    while (pcVar2 = cmStateSnapshot::GetState((cmStateSnapshot *)local_38), pcVar2 != (cmState *)0x0
          ) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_78,(cmStateSnapshot *)local_38);
      pcVar1 = cmStateDirectory::GetProperty
                         ((cmStateDirectory *)local_78,(string *)dirSnapshot.Position.Position);
      if (pcVar1 != (char *)0x0) {
        return true;
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent(&local_90,(cmStateSnapshot *)local_38);
    }
    mf_local._7_1_ = false;
  }
  else {
    mf_local._7_1_ = true;
  }
  return mf_local._7_1_;
}

Assistant:

bool CheckIncludeGuardIsSet(cmMakefile* mf, std::string const& includeGuardVar)
{
  if (mf->GetProperty(includeGuardVar)) {
    return true;
  }
  cmStateSnapshot dirSnapshot =
    mf->GetStateSnapshot().GetBuildsystemDirectoryParent();
  while (dirSnapshot.GetState()) {
    cmStateDirectory stateDir = dirSnapshot.GetDirectory();
    if (stateDir.GetProperty(includeGuardVar)) {
      return true;
    }
    dirSnapshot = dirSnapshot.GetBuildsystemDirectoryParent();
  }
  return false;
}